

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::handleUnaryMath
          (TParseContext *this,TSourceLoc *loc,char *str,TOperator op,TIntermTyped *childNode)

{
  TIntermediate *pTVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar5;
  TString local_58;
  undefined4 extraout_var_00;
  
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])();
  iVar3 = (*(childNode->super_TIntermNode)._vptr_TIntermNode[0x1e])(childNode);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 400))
                    ((long *)CONCAT44(extraout_var,iVar3),3);
  if ((cVar2 == '\0') ||
     (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x14])
                        (this), (char)iVar3 != '\0')) {
    iVar3 = (*(childNode->super_TIntermNode)._vptr_TIntermNode[0x1e])(childNode);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    cVar2 = (**(code **)(*plVar4 + 400))(plVar4,6);
    if (((cVar2 == '\0') && (cVar2 = (**(code **)(*plVar4 + 400))(plVar4,7), cVar2 == '\0')) ||
       (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x17])
                          (this), (char)iVar3 != '\0')) {
      iVar3 = (*(childNode->super_TIntermNode)._vptr_TIntermNode[0x1e])(childNode);
      plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
      cVar2 = (**(code **)(*plVar4 + 400))(plVar4,4);
      if ((((cVar2 == '\0') && (cVar2 = (**(code **)(*plVar4 + 400))(plVar4,5), cVar2 == '\0')) ||
          (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1a]
                   )(this), (char)iVar3 != '\0')) &&
         (pTVar5 = TIntermediate::addUnaryMath
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                              childNode,loc), pTVar5 != (TIntermTyped *)0x0)) {
        return pTVar5;
      }
    }
  }
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TIntermTyped::getCompleteString_abi_cxx11_
            (&local_58,childNode,(bool)(pTVar1->source == EShSourceGlsl & pTVar1->enhancedMsgs));
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc," wrong operand type",str,
             "no operation \'%s\' exists that takes an operand of type %s (or there is no acceptable conversion)"
             ,str,local_58._M_dataplus._M_p);
  return childNode;
}

Assistant:

TIntermTyped* TParseContext::handleUnaryMath(const TSourceLoc& loc, const char* str, TOperator op, TIntermTyped* childNode)
{
    rValueErrorCheck(loc, str, childNode);

    bool allowed = true;
    if ((childNode->getType().contains16BitFloat() && !float16Arithmetic()) ||
        (childNode->getType().contains16BitInt() && !int16Arithmetic()) ||
        (childNode->getType().contains8BitInt() && !int8Arithmetic())) {
        allowed = false;
    }

    TIntermTyped* result = nullptr;
    if (allowed)
        result = intermediate.addUnaryMath(op, childNode, loc);

    if (result)
        return result;
    else {
        bool enhanced = intermediate.getEnhancedMsgs();
        unaryOpError(loc, str, childNode->getCompleteString(enhanced));
    }

    return childNode;
}